

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
::set_empty_key(dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                *this,key_type *key)

{
  pointer ppVar1;
  libc_allocator_with_realloc<std::pair<const_int,_A>_> *in_RSI;
  sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *in_RDI;
  dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *unaff_retaddr;
  sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *table_start;
  
  table_start = in_RDI;
  sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::set_use_empty
            (in_RDI,true);
  *(undefined4 *)((long)&in_RDI[1].enlarge_threshold_ + 4) = *(undefined4 *)in_RSI;
  ppVar1 = libc_allocator_with_realloc<std::pair<const_int,_A>_>::allocate
                     (in_RSI,(size_type)in_RDI,(const_pointer)0x109de13);
  in_RDI[2].shrink_threshold_ = (size_type)ppVar1;
  fill_range_with_empty(unaff_retaddr,(pointer)table_start,(size_type)in_RSI);
  return;
}

Assistant:

void set_empty_key(const key_type& key) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    assert(
        (!settings.use_deleted() || !equals(key, key_info.delkey)) &&
        "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty_key = key;

    assert(!table);  // must set before first use
    // num_buckets was set in constructor even though table was NULL
    table = val_info.allocate(num_buckets);
    assert(table);
    fill_range_with_empty(table, num_buckets);
  }